

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

void t1_parse_font_matrix(T1_Face face,T1_Loader loader)

{
  FT_Int FVar1;
  FT_Long FVar2;
  bool bVar3;
  long local_80;
  FT_Int result;
  FT_Fixed temp_scale;
  FT_Fixed temp [6];
  FT_Face root;
  FT_Vector *offset;
  FT_Matrix *matrix;
  T1_Parser parser;
  T1_Loader loader_local;
  T1_Face face_local;
  
  temp[5] = (FT_Fixed)face;
  FVar1 = (*(loader->parser).root.funcs.to_fixed_array)((PS_Parser)loader,6,&temp_scale,3);
  if (FVar1 < 6) {
    (loader->parser).root.error = 3;
  }
  else {
    if (temp[2] < 0) {
      local_80 = -temp[2];
    }
    else {
      local_80 = temp[2];
    }
    if (local_80 == 0) {
      (loader->parser).root.error = 3;
    }
    else {
      if (local_80 != 0x10000) {
        FVar2 = FT_DivFix(1000,local_80);
        *(short *)(temp[5] + 0x88) = (short)FVar2;
        temp_scale = FT_DivFix(temp_scale,local_80);
        temp[0] = FT_DivFix(temp[0],local_80);
        temp[1] = FT_DivFix(temp[1],local_80);
        temp[3] = FT_DivFix(temp[3],local_80);
        temp[4] = FT_DivFix(temp[4],local_80);
        bVar3 = temp[2] < 0;
        temp[2] = 0x10000;
        if (bVar3) {
          temp[2] = -0x10000;
        }
      }
      (face->type1).font_matrix.xx = temp_scale;
      (face->type1).font_matrix.yx = temp[0];
      (face->type1).font_matrix.xy = temp[1];
      (face->type1).font_matrix.yy = temp[2];
      (face->type1).font_offset.x = temp[3] >> 0x10;
      (face->type1).font_offset.y = temp[4] >> 0x10;
    }
  }
  return;
}

Assistant:

static void
  t1_parse_font_matrix( T1_Face    face,
                        T1_Loader  loader )
  {
    T1_Parser   parser = &loader->parser;
    FT_Matrix*  matrix = &face->type1.font_matrix;
    FT_Vector*  offset = &face->type1.font_offset;
    FT_Face     root   = (FT_Face)&face->root;
    FT_Fixed    temp[6];
    FT_Fixed    temp_scale;
    FT_Int      result;


    /* input is scaled by 1000 to accommodate default FontMatrix */
    result = T1_ToFixedArray( parser, 6, temp, 3 );

    if ( result < 6 )
    {
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    temp_scale = FT_ABS( temp[3] );

    if ( temp_scale == 0 )
    {
      FT_ERROR(( "t1_parse_font_matrix: invalid font matrix\n" ));
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* atypical case */
    if ( temp_scale != 0x10000L )
    {
      /* set units per EM based on FontMatrix values */
      root->units_per_EM = (FT_UShort)FT_DivFix( 1000, temp_scale );

      temp[0] = FT_DivFix( temp[0], temp_scale );
      temp[1] = FT_DivFix( temp[1], temp_scale );
      temp[2] = FT_DivFix( temp[2], temp_scale );
      temp[4] = FT_DivFix( temp[4], temp_scale );
      temp[5] = FT_DivFix( temp[5], temp_scale );
      temp[3] = temp[3] < 0 ? -0x10000L : 0x10000L;
    }

    matrix->xx = temp[0];
    matrix->yx = temp[1];
    matrix->xy = temp[2];
    matrix->yy = temp[3];

    /* note that the offsets must be expressed in integer font units */
    offset->x = temp[4] >> 16;
    offset->y = temp[5] >> 16;
  }